

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O3

bool __thiscall
cmDepends::Check(cmDepends *this,char *makeFile,char *internalFile,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                *validDeps)

{
  int iVar1;
  bool collapse;
  bool bVar2;
  string oldcwd;
  ifstream fin;
  allocator local_279;
  string local_278;
  string local_258;
  string local_238;
  byte abStack_218 [488];
  
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,".","");
  iVar1 = std::__cxx11::string::compare((char *)&this->CompileDirectory);
  if (iVar1 != 0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_238,(SystemTools *)0x0,collapse);
    std::__cxx11::string::operator=((string *)&local_278,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ChangeDirectory(&this->CompileDirectory);
  }
  std::ifstream::ifstream(&local_238,internalFile,_S_in);
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
    iVar1 = (*this->_vptr_cmDepends[3])(this,&local_238,internalFile,validDeps);
    bVar2 = true;
    if ((char)iVar1 != '\0') goto LAB_0041b818;
  }
  Clear(this,makeFile);
  std::__cxx11::string::string((string *)&local_258,internalFile,&local_279);
  cmsys::SystemTools::RemoveFile(&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_0041b818:
  iVar1 = std::__cxx11::string::compare((char *)&local_278);
  if (iVar1 != 0) {
    cmsys::SystemTools::ChangeDirectory(&local_278);
  }
  std::ifstream::~ifstream(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmDepends::Check(const char *makeFile, const char *internalFile,
                      std::map<std::string, DependencyVector>& validDeps)
{
  // Dependency checks must be done in proper working directory.
  std::string oldcwd = ".";
  if(this->CompileDirectory != ".")
    {
    // Get the CWD but do not call CollapseFullPath because
    // we only need it to cd back, and the form does not matter
    oldcwd = cmSystemTools::GetCurrentWorkingDirectory(false);
    cmSystemTools::ChangeDirectory(this->CompileDirectory);
    }

  // Check whether dependencies must be regenerated.
  bool okay = true;
  cmsys::ifstream fin(internalFile);
  if(!(fin && this->CheckDependencies(fin, internalFile, validDeps)))
    {
    // Clear all dependencies so they will be regenerated.
    this->Clear(makeFile);
    cmSystemTools::RemoveFile(internalFile);
    okay = false;
    }

  // Restore working directory.
  if(oldcwd != ".")
    {
    cmSystemTools::ChangeDirectory(oldcwd);
    }

  return okay;
}